

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

CHAR LocalRegionGrayValuePredictTI(IplImage *pImage)

{
  CHAR CVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar5 = pImage->widthStep + 1;
  iVar6 = 1;
  iVar2 = 0;
  uVar3 = 300;
  do {
    lVar7 = 0;
    do {
      uVar4 = pImage->imageData[(uint)(iVar5 + (int)lVar7)] ^ 0xff;
      iVar2 = iVar2 + uVar4;
      if (uVar3 < uVar4) {
        uVar4 = uVar3;
      }
      uVar3 = uVar4;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    iVar6 = iVar6 + 1;
    iVar5 = iVar5 + pImage->widthStep;
  } while (iVar6 != 5);
  iVar5 = pImage->widthStep + 9;
  iVar6 = 1;
  do {
    lVar7 = 0;
    do {
      uVar4 = pImage->imageData[(uint)(iVar5 + (int)lVar7)] ^ 0xff;
      iVar2 = iVar2 + uVar4;
      if (uVar3 < uVar4) {
        uVar4 = uVar3;
      }
      uVar3 = uVar4;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    iVar6 = iVar6 + 1;
    iVar5 = iVar5 + pImage->widthStep;
  } while (iVar6 != 5);
  CVar1 = 'I';
  if (0x524 < iVar2 + uVar3 * -0x24) {
    CVar1 = 'T';
  }
  return CVar1;
}

Assistant:

CHAR LocalRegionGrayValuePredictTI(IplImage *pImage) {
    INT32U row, col, locate_value, sum_value = 0, min_value = 300;
//    区域 [1:5,1:6], 4*5
    for (row = 1; row < 5; row++) {
        for (col = 1; col < 6; col++) {
            // get the pixel, 黑白颠倒
            locate_value = (INT32U) (255 - pImage->imageData[row * pImage->widthStep + col]);
            sum_value += locate_value;
            if (locate_value < min_value) {
                min_value = locate_value;
            }
        }
    }
//    区域 [1:5,9:14],4*4
    for (row = 1; row < 5; row++) {
        for (col = 9; col < 14; col++) {
            // get the pixel, 黑白颠倒
            locate_value = (INT32U) (255 - pImage->imageData[row * pImage->widthStep + col]);
            sum_value += locate_value;
            if (locate_value < min_value) {
                min_value = locate_value;
            }
        }
    }
//    总共40个像素点：4*5+4*4=36
//    printf("%d,%d,%d\n",sum_value,min_value,(sum_value-min_value*36));
    if (sum_value - min_value * 36 > 1316)
        return 'T';
    else
        return 'I';
}